

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
TargetPropertyEntryFileSet::Evaluate
          (TargetPropertyEntryFileSet *this,cmLocalGenerator *lg,string *config,
          cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,string *param_5)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  filesPerDir;
  string local_38;
  
  p_Var1 = &filesPerDir._M_t._M_impl.super__Rb_tree_header;
  filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  filesPerDir._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  cmFileSet::EvaluateFileEntry
            (this->FileSet,&this->BaseDirs,&filesPerDir,&this->EntryCge,lg,config,headTarget,
             dagChecker);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var3 = filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files,
               (const_iterator)
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(p_Var3 + 2),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               p_Var3[2]._M_parent);
  }
  if (Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
      ::filesStr_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                                 ::filesStr_abi_cxx11_);
    if (iVar2 != 0) {
      Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
      ::filesStr_abi_cxx11_._M_dataplus._M_p =
           (pointer)&Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                     ::filesStr_abi_cxx11_.field_2;
      Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
      ::filesStr_abi_cxx11_._M_string_length = 0;
      Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
      ::filesStr_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                    ::filesStr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                           ::filesStr_abi_cxx11_);
    }
  }
  separator._M_str = ";";
  separator._M_len = 1;
  cmJoin(&local_38,&files,separator,(string_view)ZEXT816(0));
  std::__cxx11::string::operator=
            ((string *)
             &Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
              ::filesStr_abi_cxx11_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&filesPerDir._M_t);
  return &Evaluate(cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
          ::filesStr_abi_cxx11_;
}

Assistant:

const std::string& Evaluate(cmLocalGenerator* lg, const std::string& config,
                              cmGeneratorTarget const* headTarget,
                              cmGeneratorExpressionDAGChecker* dagChecker,
                              std::string const& /*lang*/) const override
  {
    std::map<std::string, std::vector<std::string>> filesPerDir;
    this->FileSet->EvaluateFileEntry(this->BaseDirs, filesPerDir,
                                     this->EntryCge, lg, config, headTarget,
                                     dagChecker);

    std::vector<std::string> files;
    for (auto const& it : filesPerDir) {
      files.insert(files.end(), it.second.begin(), it.second.end());
    }

    static std::string filesStr;
    filesStr = cmJoin(files, ";");
    return filesStr;
  }